

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkPipelineCreateFlags2CreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineCreateFlags2CreateInfo>
          (Impl *this,VkPipelineCreateFlags2CreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkPipelineCreateFlags2CreateInfo *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkPipelineCreateFlags2CreateInfo *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkPipelineCreateFlags2CreateInfo>(alloc,count)
    ;
    if (this_local != (Impl *)0x0) {
      std::copy<VkPipelineCreateFlags2CreateInfo_const*,VkPipelineCreateFlags2CreateInfo*>
                (src,src + count,(VkPipelineCreateFlags2CreateInfo *)this_local);
    }
  }
  return (VkPipelineCreateFlags2CreateInfo *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}